

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhMapInstallBucket(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)

{
  SyMemBackend *pBackend;
  sxu32 sVar1;
  lhash_bmap_rec *plVar2;
  lhash_bmap_rec *plVar3;
  lhash_bmap_rec **pplVar4;
  lhash_bmap_rec **pplVar5;
  sxu32 sVar6;
  uint uVar7;
  bool bVar8;
  
  pBackend = &pEngine->sAllocator;
  plVar3 = (lhash_bmap_rec *)SyMemBackendPoolAlloc(pBackend,0x30);
  if (plVar3 == (lhash_bmap_rec *)0x0) {
    return -1;
  }
  SyZero(plVar3,0x30);
  plVar3->iLogic = iLogic;
  plVar3->iReal = iReal;
  sVar1 = pEngine->nBuckSize;
  uVar7 = (uint)iLogic & sVar1 - 1;
  pplVar4 = pEngine->apMap;
  plVar2 = pplVar4[uVar7];
  plVar3->pNextCol = plVar2;
  if (plVar2 != (lhash_bmap_rec *)0x0) {
    plVar2->pPrevCol = plVar3;
  }
  pplVar4[uVar7] = plVar3;
  pplVar4 = &pEngine->pList;
  if (pEngine->pFirst == (lhash_bmap_rec *)0x0) {
    pplVar5 = &pEngine->pFirst;
  }
  else {
    plVar2 = *pplVar4;
    pplVar5 = pplVar4;
    if (plVar2 == (lhash_bmap_rec *)0x0) goto LAB_00111707;
    plVar3->pNext = plVar2;
    pplVar4 = &plVar2->pPrev;
  }
  *pplVar4 = plVar3;
LAB_00111707:
  *pplVar5 = plVar3;
  uVar7 = pEngine->nBuckRec + 1;
  pEngine->nBuckRec = uVar7;
  if (uVar7 < 100000 && sVar1 * 3 <= uVar7) {
    pplVar4 = (lhash_bmap_rec **)SyMemBackendAlloc(pBackend,sVar1 << 4);
    if (pplVar4 != (lhash_bmap_rec **)0x0) {
      SyZero(pplVar4,sVar1 << 4);
      pplVar5 = &pEngine->pList;
      sVar6 = pEngine->nBuckRec;
      while (bVar8 = sVar6 != 0, sVar6 = sVar6 - 1, bVar8) {
        plVar3 = *pplVar5;
        plVar3->pNextCol = (lhash_bmap_rec *)0x0;
        plVar3->pPrevCol = (lhash_bmap_rec *)0x0;
        uVar7 = (uint)plVar3->iLogic & sVar1 * 2 - 1;
        plVar2 = pplVar4[uVar7];
        plVar3->pNextCol = plVar2;
        if (plVar2 != (lhash_bmap_rec *)0x0) {
          plVar2->pPrevCol = plVar3;
        }
        pplVar4[uVar7] = plVar3;
        pplVar5 = &plVar3->pNext;
      }
      SyMemBackendFree(pBackend,pEngine->apMap);
      pEngine->apMap = pplVar4;
      pEngine->nBuckSize = sVar1 * 2;
    }
  }
  return 0;
}

Assistant:

static int lhMapInstallBucket(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)
{
	lhash_bmap_rec *pRec;
	sxu32 iBucket;
	/* Allocate a new instance */
	pRec = (lhash_bmap_rec *)SyMemBackendPoolAlloc(&pEngine->sAllocator,sizeof(lhash_bmap_rec));
	if( pRec == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pRec,sizeof(lhash_bmap_rec));
	/* Fill in the structure */
	pRec->iLogic = iLogic;
	pRec->iReal = iReal;
	iBucket = iLogic & (pEngine->nBuckSize - 1);
	pRec->pNextCol = pEngine->apMap[iBucket];
	if( pEngine->apMap[iBucket] ){
		pEngine->apMap[iBucket]->pPrevCol = pRec;
	}
	pEngine->apMap[iBucket] = pRec;
	/* Link */
	if( pEngine->pFirst == 0 ){
		pEngine->pFirst = pEngine->pList = pRec;
	}else{
		MACRO_LD_PUSH(pEngine->pList,pRec);
	}
	pEngine->nBuckRec++;
	if( (pEngine->nBuckRec >= pEngine->nBuckSize * 3) && pEngine->nBuckRec < 100000 ){
		/* Allocate a new larger table */
		sxu32 nNewSize = pEngine->nBuckSize << 1;
		lhash_bmap_rec *pEntry;
		lhash_bmap_rec **apNew;
		sxu32 n;
		
		apNew = (lhash_bmap_rec **)SyMemBackendAlloc(&pEngine->sAllocator, nNewSize * sizeof(lhash_bmap_rec *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(lhash_bmap_rec *));
			/* Rehash all entries */
			n = 0;
			pEntry = pEngine->pList;
			for(;;){
				/* Loop one */
				if( n >= pEngine->nBuckRec ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->iLogic & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket] ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pEngine->sAllocator,(void *)pEngine->apMap);
			pEngine->apMap = apNew;
			pEngine->nBuckSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}